

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.h
# Opt level: O0

ParameterList * __thiscall
bhf::ParameterList::Get<std::__cxx11::string>
          (ParameterList *this,string *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue)

{
  bool bVar1;
  runtime_error *this_00;
  pointer ppVar2;
  string *in_RCX;
  string local_88 [35];
  undefined1 local_65;
  string local_58 [32];
  _Self local_38;
  _Self local_30;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue_local;
  string *key_local;
  ParameterList *this_local;
  
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>_>
               *)key,defaultValue);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>_>
              *)key);
  bVar1 = std::operator==(&local_30,&local_38);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ParameterOption>_>
             ::operator->(&local_30);
    std::__cxx11::string::string(local_88,in_RCX);
    bhf::StringTo<std::__cxx11::string>(this,&(ppVar2->second).value,local_88);
    std::__cxx11::string::~string(local_88);
    return this;
  }
  local_65 = 1;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "invalid parameter ");
  std::runtime_error::runtime_error(this_00,local_58);
  local_65 = 0;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T Get(const std::string& key, const T defaultValue = {}) const
    {
        auto it = map.find(key);
        if (it == map.end()) {
            throw std::runtime_error("invalid parameter " + key);
        }
        return StringTo<T>(it->second.value, defaultValue);
    }